

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O2

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::copy
          (basic_string_view<char,_std::char_traits<char>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX *pEVar1;
  out_of_range *this_00;
  ulong in_RCX;
  allocator local_49;
  out_of_range local_48 [16];
  string local_38 [32];
  
  pEVar1 = (EVP_PKEY_CTX *)(this->size_ - in_RCX);
  if (in_RCX <= this->size_) {
    if (pEVar1 < src) {
      src = pEVar1;
    }
    if (src != (EVP_PKEY_CTX *)0x0) {
      memcpy(dst,this->data_ + in_RCX,(size_t)src);
    }
    return (int)src;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_38,"nonstd::string_view::copy()",&local_49);
  std::out_of_range::out_of_range(local_48,local_38);
  std::out_of_range::out_of_range(this_00,local_48);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

nssv_constexpr size_type size()     const nssv_noexcept { return size_; }